

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fopen.c
# Opt level: O1

CURLcode Curl_fopen(Curl_easy *data,char *filename,FILE **fh,char **tempname)

{
  int iVar1;
  CURLcode CVar2;
  int iVar3;
  CURLcode CVar4;
  char *__file;
  FILE *pFVar5;
  uchar randsuffix [9];
  stat sb;
  stat nsb;
  uchar local_159 [9];
  stat64 local_150;
  stat64 local_c0;
  
  *tempname = (char *)0x0;
  iVar1 = stat64(filename,&local_150);
  if ((iVar1 == -1) || ((local_150.st_mode & 0xf000) != 0x8000)) {
    pFVar5 = fopen64(filename,"w");
    *fh = (FILE *)pFVar5;
    if (pFVar5 != (FILE *)0x0) {
      return CURLE_OK;
    }
    iVar1 = -1;
    CVar2 = CURLE_WRITE_ERROR;
    __file = (char *)0x0;
  }
  else {
    CVar2 = Curl_rand_hex(data,local_159,9);
    if (CVar2 == CURLE_OK) {
      __file = curl_maprintf("%s.%s.tmp",filename,local_159);
      if (__file == (char *)0x0) {
        CVar2 = CURLE_OUT_OF_MEMORY;
        goto LAB_0012f1d6;
      }
      iVar1 = open64(__file,0xc1,0x180);
      CVar2 = CURLE_WRITE_ERROR;
      if (iVar1 != -1) {
        iVar3 = fstat64(iVar1,&local_c0);
        if ((((iVar3 == -1) || (local_c0.st_uid != local_150.st_uid)) ||
            (local_c0.st_gid != local_150.st_gid)) ||
           (iVar3 = fchmod(iVar1,local_150.st_mode), iVar3 != -1)) {
          pFVar5 = fdopen(iVar1,"w");
          *fh = (FILE *)pFVar5;
          CVar4 = CURLE_OK;
          if (pFVar5 != (FILE *)0x0) goto LAB_0012f232;
        }
        goto LAB_0012f20b;
      }
    }
    else {
LAB_0012f1d6:
      __file = (char *)0x0;
    }
    iVar1 = -1;
  }
LAB_0012f20b:
  if (iVar1 != -1) {
    close(iVar1);
    unlink(__file);
  }
  (*Curl_cfree)(__file);
  __file = (char *)0x0;
  CVar4 = CVar2;
LAB_0012f232:
  *tempname = __file;
  return CVar4;
}

Assistant:

CURLcode Curl_fopen(struct Curl_easy *data, const char *filename,
                    FILE **fh, char **tempname)
{
  CURLcode result = CURLE_WRITE_ERROR;
  unsigned char randsuffix[9];
  char *tempstore = NULL;
  struct_stat sb;
  int fd = -1;
  *tempname = NULL;

  if(stat(filename, &sb) == -1 || !S_ISREG(sb.st_mode)) {
    /* a non-regular file, fallback to direct fopen() */
    *fh = fopen(filename, FOPEN_WRITETEXT);
    if(*fh)
      return CURLE_OK;
    goto fail;
  }

  result = Curl_rand_hex(data, randsuffix, sizeof(randsuffix));
  if(result)
    goto fail;

  tempstore = aprintf("%s.%s.tmp", filename, randsuffix);
  if(!tempstore) {
    result = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  result = CURLE_WRITE_ERROR;
  fd = open(tempstore, O_WRONLY | O_CREAT | O_EXCL, 0600);
  if(fd == -1)
    goto fail;

#ifdef HAVE_FCHMOD
  {
    struct_stat nsb;
    if((fstat(fd, &nsb) != -1) &&
       (nsb.st_uid == sb.st_uid) && (nsb.st_gid == sb.st_gid)) {
      /* if the user and group are the same, clone the original mode */
      if(fchmod(fd, sb.st_mode) == -1)
        goto fail;
    }
  }
#endif

  *fh = fdopen(fd, FOPEN_WRITETEXT);
  if(!*fh)
    goto fail;

  *tempname = tempstore;
  return CURLE_OK;

fail:
  if(fd != -1) {
    close(fd);
    unlink(tempstore);
  }

  free(tempstore);

  *tempname = NULL;
  return result;
}